

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::anon_unknown_2::AnalyzeDependencyForFile
               (FileDescriptor *file,
               set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *nodes_without_dependency,
               map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
               *deps,map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                     *dependency_count)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  _Base_ptr p_Var3;
  int iVar4;
  FileDescriptor *pFVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this;
  _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
  *this_00;
  _Rb_tree_header *p_Var8;
  int iVar9;
  int iVar10;
  bool bVar11;
  FileDescriptor *dependency;
  FileDescriptor *local_78;
  FileDescriptor *local_70;
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_68;
  
  iVar10 = *(int *)(file + 0x20);
  local_78 = file;
  if (0 < iVar10) {
    iVar9 = 0;
    do {
      pFVar5 = FileDescriptor::dependency(local_78,iVar9);
      sVar2 = (*(undefined8 **)pFVar5)[1];
      if (sVar2 == kDescriptorFile_abi_cxx11_._M_string_length) {
        if (sVar2 == 0) {
          bVar11 = true;
        }
        else {
          iVar4 = bcmp((void *)**(undefined8 **)pFVar5,kDescriptorFile_abi_cxx11_._M_dataplus._M_p,
                       sVar2);
          bVar11 = iVar4 == 0;
        }
      }
      else {
        bVar11 = false;
      }
      iVar10 = iVar10 - (uint)bVar11;
    } while ((bVar11 == false) && (iVar9 = iVar9 + 1, iVar9 < *(int *)(local_78 + 0x20)));
  }
  if (iVar10 == 0) {
    std::
    _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
              ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                *)nodes_without_dependency,&local_78);
  }
  else {
    pmVar6 = std::
             map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
             ::operator[](dependency_count,&local_78);
    *pmVar6 = iVar10;
    if (0 < *(int *)(local_78 + 0x20)) {
      p_Var1 = &(deps->_M_t)._M_impl.super__Rb_tree_header;
      iVar10 = 0;
      do {
        pFVar5 = FileDescriptor::dependency(local_78,iVar10);
        sVar2 = (*(undefined8 **)pFVar5)[1];
        local_70 = pFVar5;
        if ((sVar2 != kDescriptorFile_abi_cxx11_._M_string_length) ||
           ((sVar2 != 0 &&
            (iVar9 = bcmp((void *)**(undefined8 **)pFVar5,
                          kDescriptorFile_abi_cxx11_._M_dataplus._M_p,sVar2), iVar9 != 0)))) {
          p_Var3 = (deps->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var7 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
              p_Var3 = (&p_Var3->_M_left)[*(FileDescriptor **)(p_Var3 + 1) < pFVar5]) {
            if (*(FileDescriptor **)(p_Var3 + 1) >= pFVar5) {
              p_Var7 = p_Var3;
            }
          }
          p_Var8 = p_Var1;
          if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
             (p_Var8 = (_Rb_tree_header *)p_Var7,
             pFVar5 < (FileDescriptor *)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
            p_Var8 = p_Var1;
          }
          if (p_Var8 == p_Var1) {
            local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_68._M_impl._0_8_ = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_68._M_impl.super__Rb_tree_header._M_header;
            local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_68._M_impl.super__Rb_tree_header._M_header._M_left;
            this = &std::
                    map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                    ::operator[](deps,&local_70)->_M_t;
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::clear(this);
            if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              (this->_M_impl).super__Rb_tree_header._M_header._M_color =
                   local_68._M_impl.super__Rb_tree_header._M_header._M_color;
              (this->_M_impl).super__Rb_tree_header._M_header._M_parent =
                   local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
              (this->_M_impl).super__Rb_tree_header._M_header._M_left =
                   local_68._M_impl.super__Rb_tree_header._M_header._M_left;
              (this->_M_impl).super__Rb_tree_header._M_header._M_right =
                   local_68._M_impl.super__Rb_tree_header._M_header._M_right;
              (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   &(this->_M_impl).super__Rb_tree_header._M_header;
              (this->_M_impl).super__Rb_tree_header._M_node_count =
                   local_68._M_impl.super__Rb_tree_header._M_node_count;
              local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_68._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_68._M_impl.super__Rb_tree_header._M_header;
              local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_68._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_68._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::~_Rb_tree(&local_68);
          }
          this_00 = (_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                     *)std::
                       map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                       ::operator[](deps,&local_70);
          std::
          _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>(this_00,&local_78);
          AnalyzeDependencyForFile(local_70,nodes_without_dependency,deps,dependency_count);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < *(int *)(local_78 + 0x20));
    }
  }
  return;
}

Assistant:

static void AnalyzeDependencyForFile(
    const FileDescriptor* file,
    std::set<const FileDescriptor*>* nodes_without_dependency,
    std::map<const FileDescriptor*, std::set<const FileDescriptor*>>* deps,
    std::map<const FileDescriptor*, int>* dependency_count) {
  int count = file->dependency_count();
  for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dependency = file->dependency(i);
      if (dependency->name() == kDescriptorFile) {
        count--;
        break;
      }
  }

  if (count == 0) {
    nodes_without_dependency->insert(file);
  } else {
    (*dependency_count)[file] = count;
    for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dependency = file->dependency(i);
      if (dependency->name() == kDescriptorFile) {
        continue;
      }
      if (deps->find(dependency) == deps->end()) {
        (*deps)[dependency] = std::set<const FileDescriptor*>();
      }
      (*deps)[dependency].insert(file);
      AnalyzeDependencyForFile(
          dependency, nodes_without_dependency, deps, dependency_count);
    }
  }
}